

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

mbedtls_cipher_info_t *
mbedtls_cipher_info_from_values
          (mbedtls_cipher_id_t cipher_id,int key_bitlen,mbedtls_cipher_mode_t mode)

{
  mbedtls_cipher_base_t *pmVar1;
  size_t sVar2;
  mbedtls_cipher_definition_t *local_28;
  mbedtls_cipher_definition_t *def;
  mbedtls_cipher_mode_t mode_local;
  int key_bitlen_local;
  mbedtls_cipher_id_t cipher_id_local;
  
  local_28 = mbedtls_cipher_definitions;
  while( true ) {
    if (local_28->info == (mbedtls_cipher_info_t *)0x0) {
      return (mbedtls_cipher_info_t *)0x0;
    }
    pmVar1 = mbedtls_cipher_get_base(local_28->info);
    if (((pmVar1->cipher == cipher_id) &&
        (sVar2 = mbedtls_cipher_info_get_key_bitlen(local_28->info), sVar2 == (uint)key_bitlen)) &&
       ((*(uint *)&local_28->info->field_0x8 >> 0xc & (MBEDTLS_MODE_KW|MBEDTLS_MODE_CFB)) == mode))
    break;
    local_28 = local_28 + 1;
  }
  return local_28->info;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_values(
    const mbedtls_cipher_id_t cipher_id,
    int key_bitlen,
    const mbedtls_cipher_mode_t mode)
{
    const mbedtls_cipher_definition_t *def;

    for (def = mbedtls_cipher_definitions; def->info != NULL; def++) {
        if (mbedtls_cipher_get_base(def->info)->cipher == cipher_id &&
            mbedtls_cipher_info_get_key_bitlen(def->info) == (unsigned) key_bitlen &&
            def->info->mode == mode) {
            return def->info;
        }
    }

    return NULL;
}